

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fOpaqueTypeIndexingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockArrayIndexingCase::iterate
          (BlockArrayIndexingCase *this)

{
  undefined1 *this_00;
  RenderContext *context;
  TestContext *this_01;
  pointer piVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  ContextType ctxType;
  IndexExprType IVar6;
  int iVar7;
  GLenum GVar8;
  ostream *poVar9;
  ostringstream *this_02;
  Functions *gl;
  TestError *this_03;
  _func_int **pp_Var10;
  int readNdx_2;
  int numVars;
  pointer ppvVar11;
  int readNdx_1;
  char *pcVar12;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  long lVar13;
  int *in_R8;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  int readNdx;
  GLuint GVar17;
  long lVar18;
  bool bVar19;
  void *local_488;
  ulong local_480;
  size_type local_478;
  ShaderExecutorPtr shaderExecutor;
  vector<int,_std::allocator<int>_> readIndices;
  string varName;
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inValues;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outValues;
  Random rnd;
  ShaderSpec shaderSpec;
  ostringstream global;
  ostringstream code;
  undefined4 extraout_var;
  
  iVar7 = this->m_numInstances;
  std::vector<int,_std::allocator<int>_>::vector(&readIndices,4,(allocator_type *)&global);
  local_478 = (long)iVar7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&inValues,(long)iVar7,(allocator_type *)&global);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&outValues,0x80,(allocator_type *)&global);
  shaderSpec.globalDeclarations._M_dataplus._M_p = (pointer)&shaderSpec.globalDeclarations.field_2;
  shaderSpec.version = GLSL_VERSION_300_ES;
  shaderSpec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderSpec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  shaderSpec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shaderSpec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderSpec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  shaderSpec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shaderSpec.globalDeclarations._M_string_length = 0;
  shaderSpec.globalDeclarations.field_2._M_local_buf[0] = '\0';
  shaderSpec.source._M_dataplus._M_p = (pointer)&shaderSpec.source.field_2;
  shaderSpec.source._M_string_length = 0;
  shaderSpec.source.field_2._M_local_buf[0] = '\0';
  dVar2 = ::deInt32Hash(this->m_shaderType);
  dVar3 = ::deInt32Hash(this->m_blockType);
  dVar4 = ::deInt32Hash(this->m_indexExprType);
  deRandom_init(&rnd.m_rnd,dVar2 ^ dVar3 ^ dVar4);
  iVar7 = (int)local_478;
  for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
    iVar5 = de::Random::getInt(&rnd,0,iVar7 + -1);
    readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar18] = iVar5;
  }
  uVar15 = 0;
  local_480 = 0;
  if (0 < (int)local_478) {
    local_480 = local_478 & 0xffffffff;
  }
  for (; piVar1 = readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start, local_480 != uVar15; uVar15 = uVar15 + 1) {
    dVar2 = deRandom_getUint32(&rnd.m_rnd);
    inValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar15] = dVar2;
  }
  bVar19 = this->m_blockType == BLOCKTYPE_UNIFORM;
  pcVar12 = "buffer";
  if (bVar19) {
    pcVar12 = "uniform";
  }
  pcVar16 = "std430";
  if (bVar19) {
    pcVar16 = "std140";
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar19 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&global);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&code);
  IVar6 = this->m_indexExprType;
  if (INDEX_EXPR_TYPE_CONST_EXPRESSION < IVar6 && !bVar19) {
    std::operator<<(&global.super_basic_ostream<char,_std::char_traits<char>_>,
                    "#extension GL_EXT_gpu_shader5 : require\n");
    IVar6 = this->m_indexExprType;
  }
  if (IVar6 == INDEX_EXPR_TYPE_CONST_EXPRESSION) {
    std::operator<<(&global.super_basic_ostream<char,_std::char_traits<char>_>,
                    "const highp int indexBase = 1;\n");
  }
  poVar9 = std::operator<<(&global.super_basic_ostream<char,_std::char_traits<char>_>,"layout(");
  poVar9 = std::operator<<(poVar9,pcVar16);
  poVar9 = std::operator<<(poVar9,", binding = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
  poVar9 = std::operator<<(poVar9,") ");
  poVar9 = std::operator<<(poVar9,pcVar12);
  poVar9 = std::operator<<(poVar9," ");
  poVar9 = std::operator<<(poVar9,"Block");
  poVar9 = std::operator<<(poVar9,"\n{\n\tuint value;\n} ");
  poVar9 = std::operator<<(poVar9,"block");
  poVar9 = std::operator<<(poVar9,"[");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_478);
  pcVar12 = "];\n";
  std::operator<<(poVar9,"];\n");
  if (this->m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    declareUniformIndexVars
              (&global.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,numVars);
  }
  else if (this->m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    iVar7 = 0;
    while (local_488 = (void *)CONCAT44(local_488._4_4_,iVar7), iVar7 < 4) {
      de::toString<int>((string *)&inputs,(int *)&local_488);
      std::operator+(&varName,"index",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputs);
      std::__cxx11::string::~string((string *)&inputs);
      glu::VarType::VarType((VarType *)&shaderExecutor,TYPE_INT,PRECISION_HIGHP);
      deqp::gls::ShaderExecUtil::Symbol::Symbol
                ((Symbol *)&inputs,&varName,(VarType *)&shaderExecutor);
      std::
      vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>(&shaderSpec.inputs,(Symbol *)&inputs);
      deqp::gls::ShaderExecUtil::Symbol::~Symbol((Symbol *)&inputs);
      glu::VarType::~VarType((VarType *)&shaderExecutor);
      std::__cxx11::string::~string((string *)&varName);
      iVar7 = (int)local_488 + 1;
    }
  }
  GVar17 = 2;
  iVar7 = 0;
  while (local_488 = (void *)CONCAT44(local_488._4_4_,iVar7), iVar7 < 4) {
    de::toString<int>((string *)&inputs,(int *)&local_488);
    std::operator+(&varName,"result",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputs);
    std::__cxx11::string::~string((string *)&inputs);
    glu::VarType::VarType((VarType *)&shaderExecutor,TYPE_UINT,PRECISION_HIGHP);
    deqp::gls::ShaderExecUtil::Symbol::Symbol((Symbol *)&inputs,&varName,(VarType *)&shaderExecutor)
    ;
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    emplace_back<deqp::gls::ShaderExecUtil::Symbol>(&shaderSpec.outputs,(Symbol *)&inputs);
    deqp::gls::ShaderExecUtil::Symbol::~Symbol((Symbol *)&inputs);
    glu::VarType::~VarType((VarType *)&shaderExecutor);
    std::__cxx11::string::~string((string *)&varName);
    iVar7 = (int)local_488 + 1;
  }
  for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
    poVar9 = std::operator<<(&code.super_basic_ostream<char,_std::char_traits<char>_>,"result");
    iVar7 = (int)lVar18;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    poVar9 = std::operator<<(poVar9," = ");
    poVar9 = std::operator<<(poVar9,"block");
    std::operator<<(poVar9,"[");
    if (this->m_indexExprType == INDEX_EXPR_TYPE_CONST_EXPRESSION) {
      this_02 = (ostringstream *)
                std::operator<<(&code.super_basic_ostream<char,_std::char_traits<char>_>,
                                "indexBase + ");
      iVar7 = piVar1[lVar18] + -1;
    }
    else if (this->m_indexExprType == INDEX_EXPR_TYPE_CONST_LITERAL) {
      iVar7 = piVar1[lVar18];
      this_02 = &code;
    }
    else {
      this_02 = (ostringstream *)
                std::operator<<(&code.super_basic_ostream<char,_std::char_traits<char>_>,"index");
    }
    std::ostream::operator<<(this_02,iVar7);
    std::operator<<(&code.super_basic_ostream<char,_std::char_traits<char>_>,"].value;\n");
  }
  shaderSpec.version = bVar19 | GLSL_VERSION_310_ES;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&shaderSpec.globalDeclarations,(string *)&inputs);
  std::__cxx11::string::~string((string *)&inputs);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&shaderSpec.source,(string *)&inputs);
  std::__cxx11::string::~string((string *)&inputs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&code);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&global);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  glu::TypedObjectVector<(glu::ObjectType)1>::TypedObjectVector
            ((TypedObjectVector<(glu::ObjectType)1> *)&global,context,local_478);
  GVar8 = 0x8a11;
  if (this->m_blockType == BLOCKTYPE_BUFFER) {
    GVar8 = 0x90d2;
  }
  shaderExecutor.
  super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  .m_data.ptr = deqp::gls::ShaderExecUtil::createExecutor(context,this->m_shaderType,&shaderSpec);
  code.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  code.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x0;
  code.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  varName.field_2._M_allocated_capacity = 0;
  varName._M_dataplus._M_p = (pointer)0x0;
  varName._M_string_length = 0;
  pp_Var10 = (shaderExecutor.
              super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              .m_data.ptr)->_vptr_ShaderExecutor;
  (*pp_Var10[3])(shaderExecutor.
                 super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 .m_data.ptr,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
                );
  iVar7 = (*(shaderExecutor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.ptr)->_vptr_ShaderExecutor[2])();
  if ((char)iVar7 != '\0') {
    (*(shaderExecutor.
       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
       .m_data.ptr)->_vptr_ShaderExecutor[5])();
    local_480 = local_480 << 2;
    for (lVar18 = 0; iVar7 = (int)pp_Var10, local_480 != lVar18; lVar18 = lVar18 + 4) {
      (*gl->bindBuffer)(GVar8,*(GLuint *)
                               (global.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                               lVar18));
      pp_Var10 = (_func_int **)0x88e4;
      (*gl->bufferData)(GVar8,4,(void *)((long)inValues.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar18),
                        0x88e4);
      (*gl->bindBufferBase)
                (GVar8,GVar17,
                 *(GLuint *)
                  (global.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + lVar18));
      GVar17 = GVar17 + 1;
    }
    if (this->m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
      dVar2 = (*(shaderExecutor.
                 super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 .m_data.ptr)->_vptr_ShaderExecutor[4])();
      uploadUniformIndices
                (gl,dVar2,(char *)readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,iVar7,in_R8);
    }
    else if (this->m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&code,
                 ((long)readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) * 8);
      pp_Var10 = code.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
      for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
        iVar7 = readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar18];
        for (lVar13 = 0; lVar13 != 0x80; lVar13 = lVar13 + 4) {
          *(int *)((long)pp_Var10 + lVar13) = iVar7;
        }
        pp_Var10 = pp_Var10 + 0x10;
      }
      for (lVar18 = 0; lVar18 != 0x200; lVar18 = lVar18 + 0x80) {
        local_488 = (void *)((long)code.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream + lVar18);
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&inputs,&local_488);
      }
    }
    for (lVar18 = 0; lVar18 != 0x200; lVar18 = lVar18 + 0x80) {
      local_488 = (void *)((long)outValues.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar18);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&varName,&local_488);
    }
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"Setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fOpaqueTypeIndexingTests.cpp"
                    ,0x388);
    ppvVar11 = (pointer)0x0;
    if (inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      ppvVar11 = inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
    (*(shaderExecutor.
       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
       .m_data.ptr)->_vptr_ShaderExecutor[6])
              (shaderExecutor.
               super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               .m_data.ptr,0x20,ppvVar11,varName._M_dataplus._M_p);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              ((_Vector_base<void_*,_std::allocator<void_*>_> *)&varName);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&inputs.super__Vector_base<void_*,_std::allocator<void_*>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&code);
    de::details::
    UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
    ::~UniqueBase(&shaderExecutor.
                   super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 );
    glu::ObjectVector::~ObjectVector((ObjectVector *)&global);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    this_00 = &global.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    lVar13 = 0;
    for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 1) {
      local_480 = lVar13;
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        hex.value._4_4_ = 0;
        hex.value._0_4_ =
             inValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start
             [readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14]];
        hex_00.value._4_4_ = 0;
        hex_00.value._0_4_ =
             *(uint *)((long)outValues.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar13);
        if (inValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start
            [readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar14]] !=
            *(uint *)((long)outValues.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar13)) {
          global.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,"ERROR: at invocation ");
          std::ostream::operator<<(this_00,(int)lVar18);
          std::operator<<((ostream *)this_00,", read ");
          std::ostream::operator<<(this_00,(int)lVar14);
          std::operator<<((ostream *)this_00,": expected ");
          tcu::Format::operator<<((ostream *)this_00,hex);
          std::operator<<((ostream *)this_00,", got ");
          tcu::Format::operator<<((ostream *)this_00,hex_00);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&global,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
          if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Invalid result value");
          }
        }
        lVar13 = lVar13 + 0x80;
      }
      lVar13 = local_480 + 4;
    }
    deqp::gls::ShaderExecUtil::ShaderSpec::~ShaderSpec(&shaderSpec);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&inValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&readIndices.super__Vector_base<int,_std::allocator<int>_>);
    return STOP;
  }
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_03,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fOpaqueTypeIndexingTests.cpp"
             ,0x36a);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

BlockArrayIndexingCase::IterateResult BlockArrayIndexingCase::iterate (void)
{
	const int			numInvocations		= 32;
	const int			numInstances		= m_numInstances;
	const int			numReads			= 4;
	vector<int>			readIndices			(numReads);
	vector<deUint32>	inValues			(numInstances);
	vector<deUint32>	outValues			(numInvocations*numReads);
	ShaderSpec			shaderSpec;
	de::Random			rnd					(deInt32Hash(m_shaderType) ^ deInt32Hash(m_blockType) ^ deInt32Hash(m_indexExprType));

	for (int readNdx = 0; readNdx < numReads; readNdx++)
		readIndices[readNdx] = rnd.getInt(0, numInstances-1);

	for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		inValues[instanceNdx] = rnd.getUint32();

	getShaderSpec(&shaderSpec, numInstances, numReads, &readIndices[0], m_context.getRenderContext());

	{
		const RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&	gl				= renderCtx.getFunctions();
		const int				baseBinding		= 2;
		const BufferVector		buffers			(renderCtx, numInstances);
		const deUint32			bufTarget		= m_blockType == BLOCKTYPE_BUFFER ? GL_SHADER_STORAGE_BUFFER : GL_UNIFORM_BUFFER;
		ShaderExecutorPtr		shaderExecutor	(createExecutor(renderCtx, m_shaderType, shaderSpec));
		vector<int>				expandedIndices;
		vector<void*>			inputs;
		vector<void*>			outputs;

		m_testCtx.getLog() << *shaderExecutor;

		if (!shaderExecutor->isOk())
			TCU_FAIL("Compile failed");

		shaderExecutor->useProgram();

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			gl.bindBuffer(bufTarget, buffers[instanceNdx]);
			gl.bufferData(bufTarget, (glw::GLsizeiptr)sizeof(deUint32), &inValues[instanceNdx], GL_STATIC_DRAW);
			gl.bindBufferBase(bufTarget, baseBinding+instanceNdx, buffers[instanceNdx]);
		}

		if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
		{
			expandedIndices.resize(numInvocations * readIndices.size());

			for (int readNdx = 0; readNdx < numReads; readNdx++)
			{
				int* dst = &expandedIndices[numInvocations*readNdx];
				std::fill(dst, dst+numInvocations, readIndices[readNdx]);
			}

			for (int readNdx = 0; readNdx < numReads; readNdx++)
				inputs.push_back(&expandedIndices[readNdx*numInvocations]);
		}
		else if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
			uploadUniformIndices(gl, shaderExecutor->getProgram(), "index", numReads, &readIndices[0]);

		for (int readNdx = 0; readNdx < numReads; readNdx++)
			outputs.push_back(&outValues[readNdx*numInvocations]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		shaderExecutor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0]);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
	{
		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			const deUint32	refValue	= inValues[readIndices[readNdx]];
			const deUint32	resValue	= outValues[readNdx*numInvocations + invocationNdx];

			if (refValue != resValue)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at invocation " << invocationNdx
													   << ", read " << readNdx << ": expected "
													   << tcu::toHex(refValue) << ", got " << tcu::toHex(resValue)
								   << TestLog::EndMessage;

				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid result value");
			}
		}
	}

	return STOP;
}